

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_encode_utils.c
# Opt level: O0

uint32_t ReverseBits(int num_bits,uint32_t bits)

{
  int i;
  uint32_t retval;
  uint32_t bits_local;
  int num_bits_local;
  
  retval = 0;
  i = 0;
  bits_local = bits;
  while (i < num_bits) {
    i = i + 4;
    retval = (uint)""[bits_local & 0xf] << (0x10U - (char)i & 0x1f) | retval;
    bits_local = bits_local >> 4;
  }
  return retval >> (0x10U - (char)num_bits & 0x1f);
}

Assistant:

static uint32_t ReverseBits(int num_bits, uint32_t bits) {
  uint32_t retval = 0;
  int i = 0;
  while (i < num_bits) {
    i += 4;
    retval |= kReversedBits[bits & 0xf] << (MAX_ALLOWED_CODE_LENGTH + 1 - i);
    bits >>= 4;
  }
  retval >>= (MAX_ALLOWED_CODE_LENGTH + 1 - num_bits);
  return retval;
}